

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  cmMakefile *pcVar2;
  int iVar3;
  pointer ppcVar4;
  uint uVar5;
  pointer ppcVar6;
  ulong uVar7;
  uint uVar8;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> autogenTargets;
  _Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->FilesReplacedDuringGenerate);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->CMP0042WarnTargets)._M_t);
  iVar3 = (*this->_vptr_cmGlobalGenerator[0x22])(this);
  uVar5 = 0;
  if ((char)iVar3 != '\0') {
    FinalizeTargetCompileInfo(this);
    CreateGenerationObjects(this,AllTargets);
    FillProjectMap(this);
    CreateQtAutoGeneratorsTargets
              ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
               &local_38,this);
    while( true ) {
      ppcVar1 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar6 = local_38._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->LocalGenerators).
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
          (ulong)uVar5) break;
      (*ppcVar1[uVar5]->_vptr_cmLocalGenerator[4])();
      uVar5 = uVar5 + 1;
    }
    for (; ppcVar6 != local_38._M_impl.super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
      cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(*ppcVar6);
    }
    uVar5 = 0;
    while( true ) {
      uVar7 = (ulong)uVar5;
      ppcVar1 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->LocalGenerators).
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar7)
      break;
      pcVar2 = ppcVar1[uVar7]->Makefile;
      for (ppcVar4 = (pcVar2->InstallGenerators).
                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppcVar4 !=
          (pcVar2->InstallGenerators).
          super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
        (*((*ppcVar4)->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])
                  (*ppcVar4,(this->LocalGenerators).
                            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7]);
      }
      uVar5 = uVar5 + 1;
    }
    (*this->_vptr_cmGlobalGenerator[9])(this);
    uVar5 = 0;
    while( true ) {
      ppcVar1 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->LocalGenerators).
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
          (ulong)uVar5) break;
      cmLocalGenerator::TraceDependencies(ppcVar1[uVar5]);
      uVar5 = uVar5 + 1;
    }
    (*this->_vptr_cmGlobalGenerator[0x25])(this);
    uVar5 = 0;
    while( true ) {
      ppcVar1 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->LocalGenerators).
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
          (ulong)uVar5) break;
      cmLocalGenerator::ComputeTargetManifest(ppcVar1[uVar5]);
      uVar5 = uVar5 + 1;
    }
    uVar5 = (*this->_vptr_cmGlobalGenerator[0x21])(this);
    if ((char)uVar5 != '\0') {
      uVar8 = 0;
      while( true ) {
        ppcVar1 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->LocalGenerators).
                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
            (ulong)uVar8) break;
        (*ppcVar1[uVar8]->_vptr_cmLocalGenerator[3])();
        uVar8 = uVar8 + 1;
      }
    }
    std::_Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
    ~_Vector_base(&local_38);
  }
  return SUB41(uVar5,0);
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if(!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS())
    {
    return false;
    }
  this->FinalizeTargetCompileInfo();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Iterate through all targets and set up automoc for those which have
  // the AUTOMOC, AUTOUIC or AUTORCC property set
  std::vector<cmGeneratorTarget const*> autogenTargets =
      this->CreateQtAutoGeneratorsTargets();
#endif

  unsigned int i;

  // Add generator specific helper commands
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->AddHelperCommands();
    }

#ifdef CMAKE_BUILD_WITH_CMAKE
  for (std::vector<cmGeneratorTarget const*>::iterator it =
       autogenTargets.begin(); it != autogenTargets.end(); ++it)
    {
    cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(*it);
    }
#endif

  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    cmMakefile* mf = this->LocalGenerators[i]->GetMakefile();
    std::vector<cmInstallGenerator*>& gens = mf->GetInstallGenerators();
    for (std::vector<cmInstallGenerator*>::const_iterator git = gens.begin();
         git != gens.end(); ++git)
      {
      (*git)->Compute(this->LocalGenerators[i]);
      }
    }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->TraceDependencies();
    }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeTargetManifest();
    }

  // Compute the inter-target dependencies.
  if(!this->ComputeTargetDepends())
    {
    return false;
    }

  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeHomeRelativeOutputPath();
    }

  return true;
}